

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

void testing::internal::PrintStringTo(string *s,ostream *os)

{
  char *pcVar1;
  size_t sVar2;
  CharFormat CVar3;
  ostream *os_local;
  string *s_local;
  
  pcVar1 = (char *)std::__cxx11::string::data();
  sVar2 = std::__cxx11::string::size();
  CVar3 = PrintCharsAsStringTo<char>(pcVar1,sVar2,os);
  if ((CVar3 == kHexEscape) && ((FLAGS_gtest_print_utf8 & 1) != 0)) {
    pcVar1 = (char *)std::__cxx11::string::data();
    sVar2 = std::__cxx11::string::size();
    anon_unknown_32::ConditionalPrintAsText(pcVar1,sVar2,os);
  }
  return;
}

Assistant:

void PrintStringTo(const ::std::string& s, ostream* os) {
  if (PrintCharsAsStringTo(s.data(), s.size(), os) == kHexEscape) {
    if (GTEST_FLAG_GET(print_utf8)) {
      ConditionalPrintAsText(s.data(), s.size(), os);
    }
  }
}